

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.cpp
# Opt level: O3

char * __thiscall
ASDCP::MXF::IndexTableSegment::IndexEntry::EncodeString
          (IndexEntry *this,char *str_buf,ui32_t buf_len)

{
  ui8_t uVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  char intbuf [64];
  undefined1 local_8e;
  uint local_8d;
  undefined1 local_89;
  undefined1 local_88 [16];
  char local_78 [72];
  
  uVar1 = this->Flags;
  local_8e = 0x72;
  if (-1 < (char)uVar1) {
    local_8e = 0x20;
  }
  local_88 = pshuflw(ZEXT216(CONCAT11(uVar1,uVar1)),ZEXT216(CONCAT11(uVar1,uVar1)),0);
  local_88 = local_88 & _DAT_001ef950;
  iVar4 = 0x49;
  if (local_88[3] == '\x02') {
    iVar4 = 0x50;
  }
  uVar5 = CONCAT13(-(local_88[3] == '\x03'),
                   CONCAT12(-(local_88[2] == '\0'),
                            CONCAT11(-(local_88[1] == '\0'),-(local_88[0] == '\0'))));
  local_8d = uVar5 & (uint)DAT_001ef990 |
             ~uVar5 & (iVar4 << 0x18 & (uint)DAT_001ef970 | (uint)DAT_001ef980);
  local_89 = 0;
  cVar2 = this->TemporalOffset;
  cVar3 = this->KeyFrameOffset;
  snprintf(local_78,0x40,"%lld",this->StreamOffset);
  snprintf(str_buf,(ulong)buf_len,"%3i %-3hhu %s %s",(ulong)(uint)(int)cVar2,(ulong)(uint)(int)cVar3
           ,&local_8e,local_78);
  return str_buf;
}

Assistant:

const char*
ASDCP::MXF::IndexTableSegment::IndexEntry::EncodeString(char* str_buf, ui32_t buf_len) const
{
  char intbuf[IntBufferLen];
  char txt_flags[6];

  txt_flags[0] = ( (Flags & 0x80) != 0 ) ? 'r' : ' ';
  txt_flags[1] = ( (Flags & 0x40) != 0 ) ? 's' : ' ';
  txt_flags[2] = ( (Flags & 0x20) != 0 ) ? 'f' : ' ';
  txt_flags[3] = ( (Flags & 0x10) != 0 ) ? 'b' : ' ';
  txt_flags[4] = ( (Flags & 0x0f) == 3 ) ? 'B' : ( (Flags & 0x0f) == 2 ) ? 'P' : 'I';
  txt_flags[5] = 0;

  snprintf(str_buf, buf_len, "%3i %-3hhu %s %s",
	   TemporalOffset, KeyFrameOffset, txt_flags,
	   i64sz(StreamOffset, intbuf));

  return str_buf;
}